

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# save.c
# Opt level: O2

void fread_pet(CHAR_DATA *ch,FILE *fp)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  MOB_INDEX_DATA *pMVar4;
  CHAR_DATA *pCVar5;
  AFFECT_DATA *paf;
  uint uVar6;
  CHAR_DATA **ppCVar7;
  char *pcVar8;
  long *vector;
  int i;
  long lVar9;
  string_view fmt;
  string_view fmt_00;
  string_view fmt_01;
  string_view fmt_02;
  int local_6c;
  int vnum;
  CHAR_DATA *local_58;
  CLogger *local_50;
  long *local_48;
  long *local_40;
  long *local_38;
  
  local_6c = (int)current_time;
  iVar3 = feof((FILE *)fp);
  if (iVar3 == 0) {
    pcVar8 = fread_word(fp);
  }
  else {
    pcVar8 = "END";
  }
  bVar2 = str_cmp(pcVar8,"Vnum");
  if (bVar2) {
    fmt._M_str = "Fread_pet: no vnum in file.";
    fmt._M_len = 0x1b;
    CLogger::Warn<>((CLogger *)&RS.field_0x140,fmt);
  }
  else {
    iVar3 = fread_number(fp);
    vnum = iVar3;
    pMVar4 = get_mob_index(iVar3);
    if (pMVar4 != (MOB_INDEX_DATA *)0x0) goto LAB_003153ee;
    fmt_00._M_str = "Fread_pet: bad vnum {}.";
    fmt_00._M_len = 0x17;
    CLogger::Warn<int&>((CLogger *)&RS.field_0x140,fmt_00,&vnum);
  }
  iVar3 = 0xc12;
LAB_003153ee:
  pMVar4 = get_mob_index(iVar3);
  pCVar5 = create_mobile(pMVar4);
  local_38 = pCVar5->comm;
  local_40 = pCVar5->act;
  local_48 = pCVar5->affected_by;
  local_50 = (CLogger *)&RS.field_0x140;
LAB_00315440:
  iVar3 = feof((FILE *)fp);
  pcVar8 = "END";
  if (iVar3 == 0) {
    pcVar8 = fread_word(fp);
  }
  cVar1 = *pcVar8;
  uVar6 = (int)cVar1 - 0x20U & 0xff;
  if (0x19 < (byte)(cVar1 + 0x9fU)) {
    uVar6 = (int)cVar1;
  }
  switch(uVar6) {
  case 0x41:
    bVar2 = str_cmp(pcVar8,"Act");
    vector = local_40;
    if ((!bVar2) || (bVar2 = str_cmp(pcVar8,"AfBy"), vector = local_48, !bVar2)) {
LAB_003158b0:
      fread_flag_new(vector,fp);
      goto LAB_00315440;
    }
    bVar2 = str_cmp(pcVar8,"Alig");
    if (!bVar2) {
      iVar3 = fread_number(fp);
      pCVar5->alignment = (short)iVar3;
      goto LAB_00315440;
    }
    bVar2 = str_cmp(pcVar8,"ACs");
    if (!bVar2) {
      for (lVar9 = 0; lVar9 != 4; lVar9 = lVar9 + 1) {
        iVar3 = fread_number(fp);
        pCVar5->armor[lVar9] = (short)iVar3;
      }
      goto LAB_00315440;
    }
    bVar2 = str_cmp(pcVar8,"Affc");
    if (!bVar2) {
      paf = new_affect();
      init_affect(paf);
      pcVar8 = fread_word(fp);
      iVar3 = skill_lookup(pcVar8);
      local_58 = ch;
      if (iVar3 < 0) {
        fmt_02._M_str = "Fread_char: unknown skill.";
        fmt_02._M_len = 0x1a;
        CLogger::Warn<>(local_50,fmt_02);
      }
      else {
        paf->type = (short)iVar3;
      }
      iVar3 = fread_number(fp);
      paf->where = (short)iVar3;
      iVar3 = fread_number(fp);
      paf->level = (short)iVar3;
      iVar3 = fread_number(fp);
      paf->duration = (short)iVar3;
      iVar3 = fread_number(fp);
      paf->modifier = (short)iVar3;
      iVar3 = fread_number(fp);
      paf->location = (short)iVar3;
      fread_flag_new(paf->bitvector,fp);
      iVar3 = fread_number(fp);
      paf->aftype = iVar3;
      pcVar8 = fread_word(fp);
      iVar3 = strcmp(pcVar8,"none");
      if (iVar3 != 0) {
        paf->owner = local_58;
      }
      ppCVar7 = &char_list;
      do {
        ppCVar7 = &((CHAR_DATA *)ppCVar7)->next->next;
        if ((CHAR_DATA *)ppCVar7 == (CHAR_DATA *)0x0) goto LAB_00315a28;
        bVar2 = str_cmp(((CHAR_DATA *)ppCVar7)->name,pcVar8);
      } while (bVar2);
      paf->owner = (CHAR_DATA *)ppCVar7;
LAB_00315a28:
      pcVar8 = fread_word(fp);
      bVar2 = str_cmp(pcVar8,"none");
      if (bVar2) {
        pcVar8 = palloc_string(pcVar8);
        paf->name = pcVar8;
      }
      paf->next = pCVar5->affected;
      pCVar5->affected = paf;
      ch = local_58;
      goto LAB_00315440;
    }
    bVar2 = str_cmp(pcVar8,"AMod");
    if (!bVar2) {
      for (lVar9 = 0; lVar9 != 5; lVar9 = lVar9 + 1) {
        iVar3 = fread_number(fp);
        pCVar5->mod_stat[lVar9] = (short)iVar3;
      }
      goto LAB_00315440;
    }
    bVar2 = str_cmp(pcVar8,"Attr");
    if (!bVar2) {
      for (lVar9 = 0; lVar9 != 5; lVar9 = lVar9 + 1) {
        iVar3 = fread_number(fp);
        pCVar5->perm_stat[lVar9] = (short)iVar3;
      }
      goto LAB_00315440;
    }
    break;
  case 0x42:
  case 0x46:
  case 0x49:
  case 0x4a:
  case 0x4b:
  case 0x4d:
  case 0x4f:
  case 0x51:
    break;
  case 0x43:
    bVar2 = str_cmp(pcVar8,"Comm");
    vector = local_38;
    if (!bVar2) goto LAB_003158b0;
    bVar2 = str_cmp(pcVar8,"Cabal");
    if (!bVar2) {
      pcVar8 = fread_string(fp);
      iVar3 = cabal_lookup(pcVar8);
      pCVar5->cabal = (short)iVar3;
      goto LAB_00315440;
    }
    break;
  case 0x44:
    bVar2 = str_cmp(pcVar8,"Dam");
    if (!bVar2) {
      iVar3 = fread_number(fp);
      pCVar5->damroll = (short)iVar3;
      goto LAB_00315440;
    }
    bVar2 = str_cmp(pcVar8,"Desc");
    if (!bVar2) {
      pcVar8 = fread_string(fp);
      pCVar5->description = pcVar8;
      goto LAB_00315440;
    }
    break;
  case 0x45:
    bVar2 = str_cmp(pcVar8,"End");
    if (!bVar2) {
      pCVar5->leader = ch;
      pCVar5->master = ch;
      ch->pet = pCVar5;
      uVar6 = (uint)((CONCAT44(current_time._4_4_,(int)current_time) - (long)local_6c) / 0x120);
      if (((0 < (int)uVar6) && (bVar2 = is_affected_by(ch,0xc), !bVar2)) &&
         (bVar2 = is_affected_by(ch,0x17), !bVar2)) {
        if (99 < uVar6) {
          uVar6 = 100;
        }
        pCVar5->hit = (int)(((int)pCVar5->max_hit - pCVar5->hit) * uVar6) / 100 + pCVar5->hit;
        pCVar5->mana = (short)((int)(((int)pCVar5->max_mana - (int)pCVar5->mana) * uVar6) / 100) +
                       pCVar5->mana;
        pCVar5->move = (short)((int)(((int)pCVar5->max_move - (int)pCVar5->move) * uVar6) / 100) +
                       pCVar5->move;
      }
      return;
    }
    bVar2 = str_cmp(pcVar8,"Exp");
    if (!bVar2) {
      iVar3 = fread_number(fp);
      pCVar5->exp = iVar3;
      goto LAB_00315440;
    }
    break;
  case 0x47:
    bVar2 = str_cmp(pcVar8,"Gold");
    if (!bVar2) {
      iVar3 = fread_number(fp);
      pCVar5->gold = (long)iVar3;
      goto LAB_00315440;
    }
    break;
  case 0x48:
    bVar2 = str_cmp(pcVar8,"Hit");
    if (!bVar2) {
      iVar3 = fread_number(fp);
      pCVar5->hitroll = (short)iVar3;
      goto LAB_00315440;
    }
    bVar2 = str_cmp(pcVar8,"HMV");
    if (!bVar2) {
      iVar3 = fread_number(fp);
      pCVar5->hit = iVar3;
      iVar3 = fread_number(fp);
      pCVar5->max_hit = (short)iVar3;
      iVar3 = fread_number(fp);
      pCVar5->mana = (short)iVar3;
      iVar3 = fread_number(fp);
      pCVar5->max_mana = (short)iVar3;
      iVar3 = fread_number(fp);
      pCVar5->move = (short)iVar3;
      iVar3 = fread_number(fp);
      pCVar5->max_move = (short)iVar3;
      goto LAB_00315440;
    }
    break;
  case 0x4c:
    bVar2 = str_cmp(pcVar8,"Levl");
    if (!bVar2) {
      iVar3 = fread_number(fp);
      pCVar5->level = (short)iVar3;
      goto LAB_00315440;
    }
    bVar2 = str_cmp(pcVar8,"LnD");
    if (!bVar2) {
      pcVar8 = fread_string(fp);
      pCVar5->long_descr = pcVar8;
      goto LAB_00315440;
    }
    bVar2 = str_cmp(pcVar8,"LogO");
    if (!bVar2) {
      local_6c = fread_number(fp);
      goto LAB_00315440;
    }
    break;
  case 0x4e:
    bVar2 = str_cmp(pcVar8,"Name");
    if (!bVar2) {
      pcVar8 = fread_string(fp);
      pCVar5->name = pcVar8;
      goto LAB_00315440;
    }
    break;
  case 0x50:
    bVar2 = str_cmp(pcVar8,"Pos");
    if (!bVar2) {
      iVar3 = fread_number(fp);
      pCVar5->position = (short)iVar3;
      goto LAB_00315440;
    }
    break;
  case 0x52:
    bVar2 = str_cmp(pcVar8,"Race");
    if (!bVar2) {
      pcVar8 = fread_string(fp);
      iVar3 = race_lookup(pcVar8);
      pCVar5->race = (short)iVar3;
      goto LAB_00315440;
    }
    break;
  case 0x53:
    bVar2 = str_cmp(pcVar8,"Save");
    if (bVar2) {
      bVar2 = str_cmp(pcVar8,"Sex");
      if (bVar2) {
        bVar2 = str_cmp(pcVar8,"ShD");
        if (bVar2) break;
        pcVar8 = fread_string(fp);
        pCVar5->short_descr = pcVar8;
      }
      else {
        iVar3 = fread_number(fp);
        pCVar5->sex = (short)iVar3;
      }
    }
    else {
      iVar3 = fread_number(fp);
      pCVar5->saving_throw = (short)iVar3;
    }
    goto LAB_00315440;
  default:
    if (uVar6 != 0x2a) break;
    goto LAB_00315813;
  }
  fmt_01._M_str = "Fread_pet: no match.";
  fmt_01._M_len = 0x14;
  CLogger::Warn<>(local_50,fmt_01);
LAB_00315813:
  fread_to_eol(fp);
  goto LAB_00315440;
}

Assistant:

void fread_pet(CHAR_DATA *ch, FILE *fp)
{
	char *word;
	CHAR_DATA *pet;
	bool fMatch;
	int lastlogoff = current_time;
	int percent;

	/* first entry had BETTER be the vnum or we barf */
	word = feof(fp) ? (char *)"END" : fread_word(fp);

	if (!str_cmp(word, "Vnum"))
	{
		int vnum;

		vnum = fread_number(fp);

		if (get_mob_index(vnum) == nullptr)
		{
			RS.Logger.Warn("Fread_pet: bad vnum {}.", vnum);
			pet = create_mobile(get_mob_index(MOB_VNUM_FIDO));
		}
		else
		{
			pet = create_mobile(get_mob_index(vnum));
		}
	}
	else
	{
		RS.Logger.Warn("Fread_pet: no vnum in file.");
		pet = create_mobile(get_mob_index(MOB_VNUM_FIDO));
	}

	for (;;)
	{
		word = feof(fp) ? (char *)"END" : fread_word(fp);
		fMatch = false;

		switch (UPPER(word[0]))
		{
			case '*':
				fMatch = true;
				fread_to_eol(fp);
				break;
			case 'A':
				KEYV("Act", pet->act)
				KEYV("AfBy", pet->affected_by)
				KEY("Alig", pet->alignment, fread_number(fp))

				if (!str_cmp(word, "ACs"))
				{
					int i;

					for (i = 0; i < 4; i++)
					{
						pet->armor[i] = fread_number(fp);
					}

					fMatch = true;
					break;
				}

				if (!str_cmp(word, "Affc"))
				{
					CHAR_DATA *wch = nullptr;
					char *owner;
					char *afname;
					AFFECT_DATA *paf;
					int sn;

					paf = new_affect();
					init_affect(paf);
					sn = skill_lookup(fread_word(fp));

					if (sn < 0)
						RS.Logger.Warn("Fread_char: unknown skill.");
					else
						paf->type = sn;

					paf->where = fread_number(fp);
					paf->level = fread_number(fp);
					paf->duration = fread_number(fp);
					paf->modifier = fread_number(fp);
					paf->location = fread_number(fp);

					fread_flag_new(paf->bitvector, fp);

					paf->aftype = fread_number(fp);

					owner = fread_word(fp);

					if (strcmp(owner, "none")) // safe default
						paf->owner = ch;

					for (wch = char_list; wch; wch = wch->next)
					{
						if (!str_cmp(wch->name, owner))
						{
							paf->owner = wch;
							break;
						}
					}

					afname = fread_word(fp);

					if (str_cmp(afname, "none"))
						paf->name = palloc_string(afname);

					paf->next = pet->affected;
					pet->affected = paf;
					fMatch = true;
					break;
				}

				if (!str_cmp(word, "AMod"))
				{
					int stat;

					for (stat = 0; stat < MAX_STATS; stat++)
					{
						pet->mod_stat[stat] = fread_number(fp);
					}

					fMatch = true;
					break;
				}

				if (!str_cmp(word, "Attr"))
				{
					int stat;

					for (stat = 0; stat < MAX_STATS; stat++)
					{
						pet->perm_stat[stat] = fread_number(fp);
					}

					fMatch = true;
					break;
				}

				break;
			case 'C':
				KEYV("Comm", pet->comm)
				KEY("Cabal", pet->cabal, cabal_lookup(fread_string(fp)))
				break;
			case 'D':
				KEY("Dam", pet->damroll, fread_number(fp))
				KEY("Desc", pet->description, fread_string(fp))
				break;
			case 'E':
				if (!str_cmp(word, "End"))
				{
					pet->leader = ch;
					pet->master = ch;
					ch->pet = pet;
					/* adjust hp mana move up  -- here for speed's sake */
					percent = (current_time - lastlogoff) * 25 / (2 * 60 * 60);

					if (percent > 0 && !is_affected_by(ch, AFF_POISON) && !is_affected_by(ch, AFF_PLAGUE))
					{
						percent = std::min(percent, 100);
						pet->hit += (pet->max_hit - pet->hit) * percent / 100;
						pet->mana += (pet->max_mana - pet->mana) * percent / 100;
						pet->move += (pet->max_move - pet->move) * percent / 100;
					}

					return;
				}

				KEY("Exp", pet->exp, fread_number(fp))
				break;
			case 'G':
				KEY("Gold", pet->gold, fread_number(fp))
				break;
			case 'H':
				KEY("Hit", pet->hitroll, fread_number(fp))

				if (!str_cmp(word, "HMV"))
				{
					pet->hit = fread_number(fp);
					pet->max_hit = fread_number(fp);
					pet->mana = fread_number(fp);
					pet->max_mana = fread_number(fp);
					pet->move = fread_number(fp);
					pet->max_move = fread_number(fp);
					fMatch = true;
					break;
				}

				break;
			case 'L':
				KEY("Levl", pet->level, fread_number(fp))
				KEY("LnD", pet->long_descr, fread_string(fp))
				KEY("LogO", lastlogoff, fread_number(fp))
				break;
			case 'N':
				KEY("Name", pet->name, fread_string(fp))
				break;
			case 'P':
				KEY("Pos", pet->position, fread_number(fp))
				break;
			case 'R':
				KEY("Race", pet->race, race_lookup(fread_string(fp)))
				break;
			case 'S':
				KEY("Save", pet->saving_throw, fread_number(fp))
				KEY("Sex", pet->sex, fread_number(fp))
				KEY("ShD", pet->short_descr, fread_string(fp))
				break;
		}

		if (!fMatch)
		{
			RS.Logger.Warn("Fread_pet: no match.");
			fread_to_eol(fp);
		}
	}
}